

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::vkRelaxedRemapUniformMembers
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType,TType *type,
          TString *identifier)

{
  int iVar1;
  anon_class_8_1_dda845c3 local_48;
  anon_class_24_3_980d5416 local_40;
  
  iVar1 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar1 != '\0') {
    iVar1 = (*type->_vptr_TType[0x36])(type);
    if ((char)iVar1 != '\0') {
      local_48.callback = &local_40;
      local_40.publicType = publicType;
      local_40.loc = loc;
      local_40.this = this;
      ForEachOpaque<glslang::TParseContext::vkRelaxedRemapUniformMembers(glslang::TSourceLoc_const&,glslang::TPublicType_const&,glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&)::$_0>(glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&,glslang::TParseContext::vkRelaxedRemapUniformMembers(glslang::TSourceLoc_const&,glslang::TPublicType_const&,glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&)::$_0)
      ::
      {lambda(glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&,bool,auto:1&)#1}
      ::operator()((_lambda_glslang__TType_const__std____cxx11__basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const__bool_auto_1___1_
                    *)&local_48,type,identifier,false,&local_48);
    }
  }
  return;
}

Assistant:

void TParseContext::vkRelaxedRemapUniformMembers(const TSourceLoc& loc, const TPublicType& publicType, const TType& type,
    const TString& identifier)
{
    if (!type.isStruct() || !type.containsOpaque())
        return;

    ForEachOpaque(type, identifier,
                  [&publicType, &loc, this](const TType& type, const TString& path) {
                      TArraySizes arraySizes = {};
                      if (type.getArraySizes()) arraySizes = *type.getArraySizes();
                      TTypeParameters typeParameters = {};
                      if (type.getTypeParameters()) typeParameters = *type.getTypeParameters();

                      TPublicType memberType{};
                      memberType.basicType = type.getBasicType();
                      memberType.sampler = type.getSampler();
                      memberType.qualifier = type.getQualifier();
                      memberType.vectorSize = type.getVectorSize();
                      memberType.matrixCols = type.getMatrixCols();
                      memberType.matrixRows = type.getMatrixRows();
                      memberType.coopmatNV = type.isCoopMatNV();
                      memberType.coopmatKHR = type.isCoopMatKHR();
                      memberType.arraySizes = nullptr;
                      memberType.userDef = nullptr;
                      memberType.loc = loc;
                      memberType.typeParameters = (type.getTypeParameters() ? &typeParameters : nullptr);
                      memberType.spirvType = nullptr;

                      memberType.qualifier.storage = publicType.qualifier.storage;
                      memberType.shaderQualifiers = publicType.shaderQualifiers;

                      TString& structMemberName = *NewPoolTString(path.c_str()); // A copy is required due to declareVariable() signature.
                      declareVariable(loc, structMemberName, memberType, nullptr, nullptr);
                  });
}